

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

Char * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **format_str,Arg *arg)

{
  Char *pCVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  FormatError *pFVar7;
  char cVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Char *s;
  uint local_68;
  int iStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint local_58;
  char local_54;
  Arg width_arg;
  
  s = *format_str;
  local_68 = 0;
  iStack_64 = 0x20;
  uStack_60 = 0;
  uStack_5c = 0;
  local_58 = 0xffffffff;
  local_54 = '\0';
  width_arg._24_8_ = s;
  if (*s == ':') {
    if (arg->type == CUSTOM) {
      (*(arg->super_Value).field_0.custom.format)
                (this,(void *)(arg->super_Value).field_0.long_long_value,&s);
      return s;
    }
    pcVar5 = s + 1;
    cVar8 = s[1];
    uVar10 = 8;
    if (cVar8 != 0) {
      cVar2 = s[2];
      iVar9 = 2;
      uVar11 = 1;
      pcVar4 = pcVar5;
      if (cVar2 == '<') goto LAB_00119d9c;
      if (cVar2 == '=') {
LAB_00119da0:
        uVar11 = 4;
        bVar3 = true;
LAB_00119da6:
        uStack_60 = uVar11;
        if (iVar9 == 1) {
          pcVar5 = s + 2;
        }
        else {
          if (cVar8 == '}') goto LAB_00119deb;
          if (cVar8 == '{') {
            s = pcVar5;
            pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(pFVar7,(CStringRef)0x122696);
            goto LAB_0011a148;
          }
          pcVar5 = s + 3;
          iStack_64 = (int)cVar8;
        }
        pcVar4 = pcVar5;
        if (bVar3) {
          s = pcVar5;
          internal::require_numeric_argument(arg,'=');
          pcVar4 = s;
        }
      }
      else {
        if (cVar2 == '^') {
LAB_00119d99:
          uVar11 = 3;
LAB_00119d9c:
          bVar3 = false;
          goto LAB_00119da6;
        }
        if (cVar2 == '>') {
LAB_00119d7b:
          uVar11 = 2;
          goto LAB_00119d9c;
        }
        iVar9 = 1;
        if (cVar8 == '<') goto LAB_00119d9c;
        if (cVar8 == '=') goto LAB_00119da0;
        if (cVar8 == '>') goto LAB_00119d7b;
        if (cVar8 == '^') goto LAB_00119d99;
      }
LAB_00119deb:
      s = pcVar4;
      cVar8 = *pcVar5;
      if (cVar8 == ' ') {
        uVar10 = 9;
        uVar11 = 1;
      }
      else if (cVar8 == '+') {
        uVar10 = 0xb;
        uVar11 = 3;
      }
      else {
        pcVar5 = s;
        if (cVar8 != '-') goto LAB_00119e25;
        uVar10 = 0xc;
        uVar11 = 4;
      }
      internal::check_sign<char>(&s,arg);
      pcVar5 = s;
      uStack_5c = uVar11;
    }
LAB_00119e25:
    s = pcVar5;
    cVar8 = *s;
    if (cVar8 == '#') {
      internal::require_numeric_argument(arg,'#');
      cVar8 = s[1];
      s = s + 1;
      uStack_5c = uVar10;
    }
    if (cVar8 == '0') {
      internal::require_numeric_argument(arg,'0');
      iStack_64 = 0x30;
      uStack_60 = 4;
      cVar8 = s[1];
      s = s + 1;
    }
    if ((byte)(cVar8 - 0x30U) < 10) {
      local_68 = internal::parse_nonnegative_int<char>(&s);
    }
    else {
      if (cVar8 != '{') goto LAB_00119f8e;
      if ((s[1] == 0x5f) || ((byte)((s[1] & 0xdfU) + 0xbf) < 0x1a)) {
        s = s + 1;
        parse_arg_name(&width_arg,this,&s);
      }
      else {
        s = s + 1;
        parse_arg_index(&width_arg,this,&s);
      }
      pcVar5 = s + 1;
      if (*s != '}') {
        s = pcVar5;
        pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(pFVar7,(CStringRef)0x122566);
        goto LAB_0011a148;
      }
      uVar6 = width_arg.super_Value.field_0.long_long_value;
      switch(width_arg.type) {
      case INT:
        uVar6 = (ulong)width_arg.super_Value.field_0.int_value;
        if ((long)uVar6 < 0) {
          s = pcVar5;
          pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(pFVar7,(CStringRef)0x1226b1);
          goto LAB_0011a148;
        }
        goto LAB_00119f8a;
      case UINT:
        uVar6 = width_arg.super_Value.field_0.ulong_long_value & 0xffffffff;
        break;
      case LONG_LONG:
        if (width_arg.super_Value.field_0.long_long_value < 0) {
          s = pcVar5;
          pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(pFVar7,(CStringRef)0x1226b1);
          goto LAB_0011a148;
        }
        break;
      case ULONG_LONG:
        break;
      default:
        s = pcVar5;
        pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(pFVar7,(CStringRef)0x1226c0);
        goto LAB_0011a148;
      }
      if (uVar6 >> 0x1f != 0) {
        s = pcVar5;
        pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(pFVar7,(CStringRef)0x122684);
        goto LAB_0011a148;
      }
LAB_00119f8a:
      local_68 = (uint)uVar6;
      s = pcVar5;
    }
LAB_00119f8e:
    cVar8 = *s;
    if (cVar8 == '.') {
      local_58 = 0;
      if ((byte)(s[1] - 0x30U) < 10) {
        s = s + 1;
        local_58 = internal::parse_nonnegative_int<char>(&s);
      }
      else {
        if (s[1] != '{') {
          s = s + 1;
          pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(pFVar7,(CStringRef)0x122701);
          goto LAB_0011a148;
        }
        if ((s[2] == 0x5f) || ((byte)((s[2] & 0xdfU) + 0xbf) < 0x1a)) {
          s = s + 2;
          parse_arg_name(&width_arg,this,&s);
        }
        else {
          s = s + 2;
          parse_arg_index(&width_arg,this,&s);
        }
        pCVar1 = s + 1;
        if (*s != '}') {
          s = pCVar1;
          pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(pFVar7,(CStringRef)0x122566);
          goto LAB_0011a148;
        }
        uVar6 = width_arg.super_Value.field_0.long_long_value;
        switch(width_arg.type) {
        case INT:
          uVar6 = (ulong)width_arg.super_Value.field_0.int_value;
          if ((long)uVar6 < 0) {
            s = pCVar1;
            pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(pFVar7,(CStringRef)0x1226d5);
            goto LAB_0011a148;
          }
          goto LAB_0011a0ad;
        case UINT:
          uVar6 = width_arg.super_Value.field_0.ulong_long_value & 0xffffffff;
          break;
        case LONG_LONG:
          if (width_arg.super_Value.field_0.long_long_value < 0) {
            s = pCVar1;
            pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(pFVar7,(CStringRef)0x1226d5);
            goto LAB_0011a148;
          }
          break;
        case ULONG_LONG:
          break;
        default:
          s = pCVar1;
          pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(pFVar7,(CStringRef)0x1226e8);
          goto LAB_0011a148;
        }
        if (uVar6 >> 0x1f != 0) {
          s = pCVar1;
          pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(pFVar7,(CStringRef)0x122684);
          goto LAB_0011a148;
        }
LAB_0011a0ad:
        local_58 = (uint)uVar6;
        s = pCVar1;
      }
      if (((int)arg->type < 8) || (arg->type == POINTER)) {
        pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
        pcVar5 = "integer";
        if (arg->type == POINTER) {
          pcVar5 = "pointer";
        }
        format<char[8]>((string *)&width_arg,(CStringRef)0x12271d,(char (*) [8])pcVar5);
        FormatError::FormatError(pFVar7,(CStringRef)width_arg.super_Value.field_0.long_long_value);
        __cxa_throw(pFVar7,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar8 = *s;
    }
    width_arg._24_8_ = s;
    if ((cVar8 != '\0') && (cVar8 != '}')) {
      width_arg._24_8_ = s + 1;
      local_54 = *s;
    }
  }
  s = (Char *)(width_arg._24_8_ + 1);
  if (*(char *)width_arg._24_8_ == '}') {
    width_arg.super_Value.field_0.long_long_value = (LongLong)this->writer_;
    width_arg.super_Value.field_0.custom.format = (FormatFunc)&local_68;
    width_arg._16_8_ = this;
    ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::ArgFormatter<char>,_void> *)&width_arg,arg);
    return s;
  }
  pFVar7 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(pFVar7,(CStringRef)0x122752);
LAB_0011a148:
  __cxa_throw(pFVar7,&FormatError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Char *BasicFormatter<Char, ArgFormatter>::format(
    const Char *&format_str, const internal::Arg &arg) {
  using internal::Arg;
  const Char *s = format_str;
  typename ArgFormatter::SpecType spec;
  if (*s == ':') {
    if (arg.type == Arg::CUSTOM) {
      arg.custom.format(this, arg.custom.value, &s);
      return s;
    }
    ++s;
    // Parse fill and alignment.
    if (Char c = *s) {
      const Char *p = s + 1;
      spec.align_ = ALIGN_DEFAULT;
      do {
        switch (*p) {
          case '<':
            spec.align_ = ALIGN_LEFT;
            break;
          case '>':
            spec.align_ = ALIGN_RIGHT;
            break;
          case '=':
            spec.align_ = ALIGN_NUMERIC;
            break;
          case '^':
            spec.align_ = ALIGN_CENTER;
            break;
        }
        if (spec.align_ != ALIGN_DEFAULT) {
          if (p != s) {
            if (c == '}') break;
            if (c == '{')
              FMT_THROW(FormatError("invalid fill character '{'"));
            s += 2;
            spec.fill_ = c;
          } else ++s;
          if (spec.align_ == ALIGN_NUMERIC)
            require_numeric_argument(arg, '=');
          break;
        }
      } while (--p >= s);
    }

    // Parse sign.
    switch (*s) {
      case '+':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '-':
        check_sign(s, arg);
        spec.flags_ |= MINUS_FLAG;
        break;
      case ' ':
        check_sign(s, arg);
        spec.flags_ |= SIGN_FLAG;
        break;
    }

    if (*s == '#') {
      require_numeric_argument(arg, '#');
      spec.flags_ |= HASH_FLAG;
      ++s;
    }

    // Parse zero flag.
    if (*s == '0') {
      require_numeric_argument(arg, '0');
      spec.align_ = ALIGN_NUMERIC;
      spec.fill_ = '0';
      ++s;
    }

    // Parse width.
    if ('0' <= *s && *s <= '9') {
      spec.width_ = internal::parse_nonnegative_int(s);
    } else if (*s == '{') {
      ++s;
      Arg width_arg = internal::is_name_start(*s) ?
            parse_arg_name(s) : parse_arg_index(s);
      if (*s++ != '}')
        FMT_THROW(FormatError("invalid format string"));
      ULongLong value = 0;
      switch (width_arg.type) {
      case Arg::INT:
        if (width_arg.int_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.int_value;
        break;
      case Arg::UINT:
        value = width_arg.uint_value;
        break;
      case Arg::LONG_LONG:
        if (width_arg.long_long_value < 0)
          FMT_THROW(FormatError("negative width"));
        value = width_arg.long_long_value;
        break;
      case Arg::ULONG_LONG:
        value = width_arg.ulong_long_value;
        break;
      default:
        FMT_THROW(FormatError("width is not integer"));
      }
      unsigned max_int = (std::numeric_limits<int>::max)();
      if (value > max_int)
        FMT_THROW(FormatError("number is too big"));
      spec.width_ = static_cast<int>(value);
    }

    // Parse precision.
    if (*s == '.') {
      ++s;
      spec.precision_ = 0;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = internal::parse_nonnegative_int(s);
      } else if (*s == '{') {
        ++s;
        Arg precision_arg = internal::is_name_start(*s) ?
              parse_arg_name(s) : parse_arg_index(s);
        if (*s++ != '}')
          FMT_THROW(FormatError("invalid format string"));
        ULongLong value = 0;
        switch (precision_arg.type) {
          case Arg::INT:
            if (precision_arg.int_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.int_value;
            break;
          case Arg::UINT:
            value = precision_arg.uint_value;
            break;
          case Arg::LONG_LONG:
            if (precision_arg.long_long_value < 0)
              FMT_THROW(FormatError("negative precision"));
            value = precision_arg.long_long_value;
            break;
          case Arg::ULONG_LONG:
            value = precision_arg.ulong_long_value;
            break;
          default:
            FMT_THROW(FormatError("precision is not integer"));
        }
        unsigned max_int = (std::numeric_limits<int>::max)();
        if (value > max_int)
          FMT_THROW(FormatError("number is too big"));
        spec.precision_ = static_cast<int>(value);
      } else {
        FMT_THROW(FormatError("missing precision specifier"));
      }
      if (arg.type <= Arg::LAST_INTEGER_TYPE || arg.type == Arg::POINTER) {
        FMT_THROW(FormatError(
            fmt::format("precision not allowed in {} format specifier",
            arg.type == Arg::POINTER ? "pointer" : "integer")));
      }
    }

    // Parse type.
    if (*s != '}' && *s)
      spec.type_ = static_cast<char>(*s++);
  }

  if (*s++ != '}')
    FMT_THROW(FormatError("missing '}' in format string"));

  // Format argument.
  ArgFormatter(*this, spec, s - 1).visit(arg);
  return s;
}